

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::AddTestPattern
          (ParameterizedTestSuiteInfo<adler32_variant> *this,char *test_suite_name,
          char *test_base_name,TestMetaFactoryBase<adler32_test> *meta_factory,
          CodeLocation *code_location)

{
  CodeLocation *this_00;
  long in_RDI;
  TestInfo *in_stack_ffffffffffffff58;
  CodeLocation *in_stack_ffffffffffffffb0;
  TestMetaFactoryBase<adler32_test> *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  TestInfo *in_stack_ffffffffffffffd0;
  
  this_00 = (CodeLocation *)(in_RDI + 0x50);
  operator_new(0x70);
  CodeLocation::CodeLocation(this_00,(CodeLocation *)in_stack_ffffffffffffff58);
  TestInfo::TestInfo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::TestInfo>::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::TestInfo,void>
            ((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::TestInfo> *
             )this_00,in_stack_ffffffffffffff58);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::TestInfo>_>_>
  ::push_back((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::TestInfo>_>_>
               *)this_00,(value_type *)in_stack_ffffffffffffff58);
  std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::TestInfo>::
  ~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<adler32_variant>::TestInfo>
               *)0x142812);
  CodeLocation::~CodeLocation((CodeLocation *)0x14281c);
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }